

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcNamedUnit>
                 (DB *db,LIST *params,IfcNamedUnit *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_1a0;
  long local_178;
  long local_168;
  TypeError *t_1;
  undefined1 local_e8 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined4 local_74;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcNamedUnit *in_local;
  LIST *params_local;
  DB *db_local;
  
  local_28 = 0;
  base = (size_t)in;
  in_local = (IfcNamedUnit *)params;
  params_local = (LIST *)db;
  sVar1 = EXPRESS::LIST::GetSize(params);
  if (sVar1 < 2) {
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 1;
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected 2 arguments to IfcNamedUnit",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_70);
  if (peVar2 == (element_type *)0x0) {
    local_168 = 0;
  }
  else {
    local_168 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_168 == 0) {
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_70);
    if (peVar2 == (element_type *)0x0) {
      local_178 = 0;
    }
    else {
      local_178 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0
                                );
    }
    if (local_178 == 0) {
      GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>>
                ((Lazy<Assimp::IFC::Schema_2x3::NotImplemented> *)(base + 0x10),
                 (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,(DB *)params_local);
    }
    else {
      std::bitset<2UL>::operator[]((bitset<2UL> *)&t,base + 8);
      std::bitset<2UL>::reference::operator=((reference *)&t,true);
      std::bitset<2UL>::reference::~reference((reference *)&t);
    }
  }
  local_74 = 2;
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_e8,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  if (peVar2 == (element_type *)0x0) {
    local_1a0 = 0;
  }
  else {
    local_1a0 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
  }
  if (local_1a0 == 0) {
    GenericConvert<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(base + 0x18),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_e8,(DB *)params_local);
  }
  else {
    std::bitset<2UL>::operator[]((bitset<2UL> *)&t_1,base + 8);
    std::bitset<2UL>::reference::operator=((reference *)&t_1,true);
    std::bitset<2UL>::reference::~reference((reference *)&t_1);
  }
  local_74 = 4;
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_e8);
  return local_28;
}

Assistant:

size_t GenericFill<IfcNamedUnit>(const DB& db, const LIST& params, IfcNamedUnit* in)
{
	size_t base = 0;
	if (params.GetSize() < 2) { throw STEP::TypeError("expected 2 arguments to IfcNamedUnit"); }    do { // convert the 'Dimensions' argument
        std::shared_ptr<const DataType> arg = params[base++];
		if (dynamic_cast<const UNSET*>(&*arg)) break;
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,2>::aux_is_derived[0]=true; break; }
        try { GenericConvert( in->Dimensions, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcNamedUnit to be a `IfcDimensionalExponents`")); }
    } while(0);
    do { // convert the 'UnitType' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,2>::aux_is_derived[1]=true; break; }
        try { GenericConvert( in->UnitType, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcNamedUnit to be a `IfcUnitEnum`")); }
    } while(0);
	return base;
}